

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSat.c
# Opt level: O3

int Abc_NodeAddClausesTop(sat_solver *pSat,Abc_Obj_t *pNode,Vec_Int_t *vVars)

{
  uint uVar1;
  void *pvVar2;
  uint Entry;
  int iVar3;
  
  pvVar2 = pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray];
  uVar1 = *(uint *)&pNode->field_0x14;
  vVars->nSize = 0;
  Entry = *(int *)((long)pvVar2 + 0x10) * 2;
  if ((uVar1 >> 10 & 1) == 0) {
    Vec_IntPush(vVars,Entry | 1);
    Vec_IntPush(vVars,pNode->Id * 2);
    iVar3 = sat_solver_addclause(pSat,vVars->pArray,vVars->pArray + vVars->nSize);
    if (iVar3 == 0) goto LAB_00309495;
    vVars->nSize = 0;
    iVar3 = *(int *)((long)pvVar2 + 0x10) * 2;
  }
  else {
    Vec_IntPush(vVars,Entry);
    Vec_IntPush(vVars,pNode->Id * 2);
    iVar3 = sat_solver_addclause(pSat,vVars->pArray,vVars->pArray + vVars->nSize);
    if (iVar3 == 0) goto LAB_00309495;
    vVars->nSize = 0;
    iVar3 = *(int *)((long)pvVar2 + 0x10) * 2 + 1;
  }
  Vec_IntPush(vVars,iVar3);
  Vec_IntPush(vVars,pNode->Id * 2 + 1);
  iVar3 = sat_solver_addclause(pSat,vVars->pArray,vVars->pArray + vVars->nSize);
  if (iVar3 != 0) {
    vVars->nSize = 0;
    Vec_IntPush(vVars,pNode->Id * 2);
    iVar3 = sat_solver_addclause(pSat,vVars->pArray,vVars->pArray + vVars->nSize);
    if (iVar3 != 0) {
      return 1;
    }
  }
LAB_00309495:
  puts("The CNF is trivially UNSAT.");
  return 0;
}

Assistant:

int Abc_NodeAddClausesTop( sat_solver * pSat, Abc_Obj_t * pNode, Vec_Int_t * vVars )
{
    Abc_Obj_t * pFanin;
    int RetValue = 0;

    pFanin = Abc_ObjFanin0(pNode);
    if ( Abc_ObjFaninC0(pNode) )
    {
        vVars->nSize = 0;
        Vec_IntPush( vVars, toLit(pFanin->Id) );
        Vec_IntPush( vVars, toLit(pNode->Id) );
        RetValue = sat_solver_addclause( pSat, vVars->pArray, vVars->pArray + vVars->nSize );
        if ( !RetValue ) 
        {
            printf( "The CNF is trivially UNSAT.\n" );
            return 0;
        }

        vVars->nSize = 0;
        Vec_IntPush( vVars, lit_neg(toLit(pFanin->Id)) );
        Vec_IntPush( vVars, lit_neg(toLit(pNode->Id)) );
        RetValue = sat_solver_addclause( pSat, vVars->pArray, vVars->pArray + vVars->nSize );
        if ( !RetValue ) 
        {
            printf( "The CNF is trivially UNSAT.\n" );
            return 0;
        }
    }
    else
    {
        vVars->nSize = 0;
        Vec_IntPush( vVars, lit_neg(toLit(pFanin->Id)) );
        Vec_IntPush( vVars, toLit(pNode->Id) );
        RetValue = sat_solver_addclause( pSat, vVars->pArray, vVars->pArray + vVars->nSize );
        if ( !RetValue ) 
        {
            printf( "The CNF is trivially UNSAT.\n" );
            return 0;
        }

        vVars->nSize = 0;
        Vec_IntPush( vVars, toLit(pFanin->Id) );
        Vec_IntPush( vVars, lit_neg(toLit(pNode->Id)) );
        RetValue = sat_solver_addclause( pSat, vVars->pArray, vVars->pArray + vVars->nSize );
        if ( !RetValue ) 
        {
            printf( "The CNF is trivially UNSAT.\n" );
            return 0;
        }
    }

    vVars->nSize = 0;
    Vec_IntPush( vVars, toLit(pNode->Id) );
    RetValue = sat_solver_addclause( pSat, vVars->pArray, vVars->pArray + vVars->nSize );
    if ( !RetValue ) 
    {
        printf( "The CNF is trivially UNSAT.\n" );
        return 0;
    }
    return 1;
}